

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-pending-on-close.c
# Opt level: O3

int run_test_signal_pending_on_close(void)

{
  int iVar1;
  char *base;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  int64_t eval_b_3;
  int64_t eval_b_6;
  int pipefds [2];
  int64_t eval_a;
  int local_20;
  uv_os_fd_t uStack_1c;
  uv_buf_t local_18;
  
  local_18.len = (size_t)local_18.base;
  iVar1 = uv_loop_init(&loop);
  local_18.base = (char *)(long)iVar1;
  _local_20 = 0;
  if ((char *)(long)iVar1 == (char *)0x0) {
    iVar1 = uv_signal_init(&loop,&signal_hdl);
    local_18.base = (char *)(long)iVar1;
    _local_20 = 0;
    if ((char *)(long)iVar1 != (char *)0x0) goto LAB_001b93af;
    iVar1 = uv_signal_start(&signal_hdl,signal_cb,0xd);
    local_18.base = (char *)(long)iVar1;
    _local_20 = 0;
    if ((char *)(long)iVar1 != (char *)0x0) goto LAB_001b93be;
    iVar1 = pipe(&local_20);
    local_18.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 != (char *)0x0) goto LAB_001b93cd;
    iVar1 = uv_pipe_init(&loop,&pipe_hdl,0);
    local_18.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 != (char *)0x0) goto LAB_001b93dc;
    iVar1 = uv_pipe_open(&pipe_hdl,uStack_1c);
    local_18.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 != (char *)0x0) goto LAB_001b93eb;
    base = (char *)malloc(0x1000000);
    buf = base;
    if (base == (char *)0x0) goto LAB_001b93fa;
    memset(base,0x2e,0x1000000);
    local_18 = uv_buf_init(base,0x1000000);
    iVar1 = uv_write(&write_req,(uv_stream_t *)&pipe_hdl,&local_18,1,write_cb);
    if (iVar1 != 0) goto LAB_001b93ff;
    close(local_20);
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001b940e;
    if (close_cb_called == 2) {
      uv_walk(&loop,close_walk_cb,(void *)0x0);
      uv_run(&loop,UV_RUN_DEFAULT);
      iVar1 = uv_loop_close(&loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b942c;
    }
  }
  else {
    run_test_signal_pending_on_close_cold_1();
LAB_001b93af:
    run_test_signal_pending_on_close_cold_2();
LAB_001b93be:
    run_test_signal_pending_on_close_cold_3();
LAB_001b93cd:
    run_test_signal_pending_on_close_cold_4();
LAB_001b93dc:
    run_test_signal_pending_on_close_cold_5();
LAB_001b93eb:
    run_test_signal_pending_on_close_cold_6();
LAB_001b93fa:
    run_test_signal_pending_on_close_cold_11();
LAB_001b93ff:
    run_test_signal_pending_on_close_cold_7();
LAB_001b940e:
    run_test_signal_pending_on_close_cold_8();
  }
  run_test_signal_pending_on_close_cold_9();
LAB_001b942c:
  run_test_signal_pending_on_close_cold_10();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
          ,0x2b,"0",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(signal_pending_on_close) {
  int pipefds[2];
  uv_buf_t buffer;
  int r;

  ASSERT_OK(uv_loop_init(&loop));

  ASSERT_OK(uv_signal_init(&loop, &signal_hdl));

  ASSERT_OK(uv_signal_start(&signal_hdl, signal_cb, SIGPIPE));

  ASSERT_OK(pipe(pipefds));

  ASSERT_OK(uv_pipe_init(&loop, &pipe_hdl, 0));

  ASSERT_OK(uv_pipe_open(&pipe_hdl, pipefds[1]));

  /* Write data large enough so it needs loop iteration */
  buf = malloc(1<<24);
  ASSERT_NOT_NULL(buf);
  memset(buf, '.', 1<<24);
  buffer = uv_buf_init(buf, 1<<24);

  r = uv_write(&write_req, (uv_stream_t *) &pipe_hdl, &buffer, 1, write_cb);
  ASSERT_OK(r);

  /* cause a SIGPIPE on write in next iteration */
  close(pipefds[0]);

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}